

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sys_logger.cpp
# Opt level: O0

int ot::commissioner::ToSysLogLevel(LogLevel aLevel)

{
  int local_10;
  int ret;
  LogLevel aLevel_local;
  
  switch(aLevel) {
  case kOff:
    local_10 = 0;
    break;
  case kCritical:
    local_10 = 2;
    break;
  case kError:
    local_10 = 3;
    break;
  case kWarn:
    local_10 = 4;
    break;
  case kInfo:
    local_10 = 6;
    break;
  case kDebug:
    local_10 = 7;
    break;
  default:
    abort();
  }
  return local_10;
}

Assistant:

static int ToSysLogLevel(LogLevel aLevel)
{
    int ret;

    switch (aLevel)
    {
    case LogLevel::kOff:
        ret = LOG_EMERG;
        break;
    case LogLevel::kCritical:
        ret = LOG_CRIT;
        break;
    case LogLevel::kError:
        ret = LOG_ERR;
        break;
    case LogLevel::kWarn:
        ret = LOG_WARNING;
        break;
    case LogLevel::kInfo:
        ret = LOG_INFO;
        break;
    case LogLevel::kDebug:
        ret = LOG_DEBUG;
        break;
    default:
        VerifyOrDie(false);
        break;
    }

    return ret;
}